

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::Event::armBreadthFirst(Event *this)

{
  long *in_FS_OFFSET;
  bool bVar1;
  Fault local_18;
  Fault f;
  Event *this_local;
  
  bVar1 = true;
  if (*(EventLoop **)(*in_FS_OFFSET + -0x10) != this->loop) {
    bVar1 = *(long *)(*in_FS_OFFSET + -0x10) == 0;
  }
  f.exception = (Exception *)this;
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[129]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
               ,0x230,FAILED,"threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr",
               "\"Event armed from different thread than it was created in.  You must use \" \"the thread-safe work queue to queue events cross-thread.\""
               ,(char (*) [129])
                "Event armed from different thread than it was created in.  You must use the thread-safe work queue to queue events cross-thread."
              );
    Debug::Fault::fatal(&local_18);
  }
  if (this->prev == (Event **)0x0) {
    this->next = *this->loop->tail;
    this->prev = this->loop->tail;
    *this->prev = this;
    if (this->next != (Event *)0x0) {
      this->next->prev = &this->next;
    }
    this->loop->tail = &this->next;
    EventLoop::setRunnable(this->loop,true);
  }
  return;
}

Assistant:

void Event::armBreadthFirst() {
  KJ_REQUIRE(threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr,
             "Event armed from different thread than it was created in.  You must use "
             "the thread-safe work queue to queue events cross-thread.");

  if (prev == nullptr) {
    next = *loop.tail;
    prev = loop.tail;
    *prev = this;
    if (next != nullptr) {
      next->prev = &next;
    }

    loop.tail = &next;

    loop.setRunnable(true);
  }
}